

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

void demmt_sync(mmt_sync *o,void *state)

{
  ssize_t sVar1;
  int iVar2;
  
  if (mmt_sync_fd == -1) {
    return;
  }
  fflush(_stdout);
  fdatasync(1);
  iVar2 = 4;
  do {
    if (iVar2 == 0) {
      fdatasync(mmt_sync_fd);
      return;
    }
    sVar1 = write(mmt_sync_fd,(void *)((long)o + (5 - (long)iVar2)),(long)iVar2);
    iVar2 = iVar2 - (int)sVar1;
  } while (0 < (int)sVar1);
  demmt_abort();
}

Assistant:

static void demmt_sync(struct mmt_sync *o, void *state)
{
	if (mmt_sync_fd == -1)
		return;

	fflush(stdout);
	fdatasync(1);
	int cnt = 4;
	while (cnt)
	{
		int r = write(mmt_sync_fd, ((char *)&o->id) + 4 - cnt, cnt);
		if (r > 0)
			cnt -= r;
		else if (r != EINTR)
			demmt_abort();
	}
	fdatasync(mmt_sync_fd);
}